

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

void __thiscall
JsrtDebuggerObjectsManager::AddToDataToDebuggerObjectsDictionary
          (JsrtDebuggerObjectsManager *this,void *data,JsrtDebuggerObjectBase *debuggerObject)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ArenaAllocator *pAVar5;
  DataToDebuggerObjectsDictionary *this_00;
  void *local_30;
  void *data_local;
  JsrtDebuggerObjectBase *debuggerObject_local;
  
  local_30 = data;
  data_local = debuggerObject;
  if (data == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0xcc,"(data != nullptr)","data != nullptr");
    if (!bVar2) goto LAB_003a8186;
    *puVar4 = 0;
  }
  if (debuggerObject == (JsrtDebuggerObjectBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0xcd,"(debuggerObject != nullptr)","debuggerObject != nullptr");
    if (!bVar2) goto LAB_003a8186;
    *puVar4 = 0;
  }
  this_00 = this->dataToDebuggerObjectsDictionary;
  if (this_00 == (DataToDebuggerObjectsDictionary *)0x0) {
    pAVar5 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    this_00 = (DataToDebuggerObjectsDictionary *)new<Memory::ArenaAllocator>(0x38,pAVar5,0x364470);
    pAVar5 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    JsUtil::
    BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary(this_00,pAVar5,10);
    this->dataToDebuggerObjectsDictionary = this_00;
  }
  bVar2 = JsUtil::
          BaseDictionary<void_*,_JsrtDebuggerObjectBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this_00,&local_30);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0xd4,"(!this->dataToDebuggerObjectsDictionary->ContainsKey(data))",
                       "!this->dataToDebuggerObjectsDictionary->ContainsKey(data)");
    if (!bVar2) goto LAB_003a8186;
    *puVar4 = 0;
  }
  iVar3 = JsUtil::
          BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<void*,JsrtDebuggerObjectBase*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->dataToDebuggerObjectsDictionary,&local_30,
                     (JsrtDebuggerObjectBase **)&data_local);
  if (iVar3 == -1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                       ,0xd8,"(index != -1)","index != -1");
    if (!bVar2) {
LAB_003a8186:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  AddToDebuggerObjectsDictionary(this,(JsrtDebuggerObjectBase *)data_local);
  return;
}

Assistant:

void JsrtDebuggerObjectsManager::AddToDataToDebuggerObjectsDictionary(void * data, JsrtDebuggerObjectBase * debuggerObject)
{
    Assert(data != nullptr);
    Assert(debuggerObject != nullptr);

    if (this->dataToDebuggerObjectsDictionary == nullptr)
    {
        this->dataToDebuggerObjectsDictionary = Anew(this->GetDebugObjectArena(), DataToDebuggerObjectsDictionary, this->GetDebugObjectArena(), 10);
    }

    Assert(!this->dataToDebuggerObjectsDictionary->ContainsKey(data));

    int index = this->dataToDebuggerObjectsDictionary->Add(data, debuggerObject);

    Assert(index != -1);

    this->AddToDebuggerObjectsDictionary(debuggerObject);
}